

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

_Bool sysbvm_identityDictionary_find
                (sysbvm_tuple_t dictionary,sysbvm_tuple_t element,sysbvm_tuple_t *outValue)

{
  _Bool _Var1;
  intptr_t iVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_array_t *storage;
  sysbvm_dictionary_t *dictionaryObject;
  intptr_t elementIndex;
  sysbvm_tuple_t *outValue_local;
  sysbvm_tuple_t element_local;
  sysbvm_tuple_t dictionary_local;
  
  *outValue = 0;
  _Var1 = sysbvm_tuple_isNonNullPointer(dictionary);
  if (_Var1) {
    iVar2 = sysbvm_identityDictionary_scanFor(dictionary,element);
    if (iVar2 < 0) {
      dictionary_local._7_1_ = false;
    }
    else if (*(long *)(*(long *)(dictionary + 0x18) + 0x10 + iVar2 * 8) == 0) {
      dictionary_local._7_1_ = false;
    }
    else {
      sVar3 = sysbvm_association_getValue
                        (*(sysbvm_tuple_t *)(*(long *)(dictionary + 0x18) + 0x10 + iVar2 * 8));
      *outValue = sVar3;
      dictionary_local._7_1_ = true;
    }
  }
  else {
    dictionary_local._7_1_ = false;
  }
  return dictionary_local._7_1_;
}

Assistant:

SYSBVM_API bool sysbvm_identityDictionary_find(sysbvm_tuple_t dictionary, sysbvm_tuple_t element, sysbvm_tuple_t *outValue)
{
    *outValue = SYSBVM_NULL_TUPLE;
    if(!sysbvm_tuple_isNonNullPointer(dictionary))
        return false;

    intptr_t elementIndex = sysbvm_identityDictionary_scanFor(dictionary, element);
    if(elementIndex < 0)
        return false;

    sysbvm_dictionary_t *dictionaryObject = (sysbvm_dictionary_t*)dictionary;
    sysbvm_array_t *storage = (sysbvm_array_t*)dictionaryObject->storage;
    if(!storage->elements[elementIndex])
        return false;

    *outValue = sysbvm_association_getValue(storage->elements[elementIndex]);
    return true;
}